

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::removeOneOfAlternatives
          (ClauseCodeTree *this,CodeOp *op,Clause *cl,
          Stack<Indexing::CodeTree::CodeOp_*> *firstsInBlocks)

{
  ulong uVar1;
  CodeOp **ppCVar2;
  CodeOp **ppCVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  
  uVar1 = op->_content;
  bVar4 = (Clause *)(uVar1 >> 3) == cl;
  bVar5 = (uVar1 & 7) == 0;
  bVar6 = (bVar4 && bVar5) && uVar1 != 0;
  if ((!bVar4 || !bVar5) || uVar1 == 0) {
    ppCVar2 = firstsInBlocks->_cursor;
    ppCVar3 = firstsInBlocks->_stack;
    do {
      op = op->_alternative;
      if (op == (CodeOp *)0x0) {
        firstsInBlocks->_cursor =
             firstsInBlocks->_stack + ((ulong)((long)ppCVar2 - (long)ppCVar3) >> 3 & 0xffffffff);
        return bVar6;
      }
      if (firstsInBlocks->_cursor == firstsInBlocks->_end) {
        ::Lib::Stack<Indexing::CodeTree::CodeOp_*>::expand(firstsInBlocks);
      }
      *firstsInBlocks->_cursor = op;
      firstsInBlocks->_cursor = firstsInBlocks->_cursor + 1;
      uVar1 = op->_content;
      bVar4 = (Clause *)(uVar1 >> 3) == cl;
      bVar5 = (uVar1 & 7) == 0;
      bVar6 = (bVar4 && bVar5) && uVar1 != 0;
    } while ((!bVar4 || !bVar5) || uVar1 == 0);
  }
  op->_content = 0;
  CodeTree::optimizeMemoryAfterRemoval(&this->super_CodeTree,firstsInBlocks,op);
  return bVar6;
}

Assistant:

bool ClauseCodeTree::removeOneOfAlternatives(CodeOp* op, Clause* cl, Stack<CodeOp*>* firstsInBlocks)
{
  unsigned initDepth=firstsInBlocks->size();

  while(!op->isSuccess() || op->getSuccessResult<Clause>()!=cl) {
    op=op->alternative();
    if(!op) {
      firstsInBlocks->truncate(initDepth);
      return false;
    }
    firstsInBlocks->push(op);
  }
  op->makeFail();
  optimizeMemoryAfterRemoval(firstsInBlocks, op);
  return true;
}